

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_defs.h
# Opt level: O0

crn_packed_uint<2U> * __thiscall
crnd::crn_packed_uint<2U>::operator=(crn_packed_uint<2U> *this,uint val)

{
  uint local_18;
  int local_14;
  uint i;
  uint val_local;
  crn_packed_uint<2U> *this_local;
  
  local_14 = val << 0x10;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    this->m_buf[local_18] = (uchar)((uint)local_14 >> 0x18);
    local_14 = local_14 << 8;
  }
  return this;
}

Assistant:

inline crn_packed_uint& operator=(unsigned int val)
        {
            //CRND_ASSERT((N == 4U) || (val < (1U << (N * 8U))));

            val <<= (8U * (4U - N));

            for (unsigned int i = 0; i < N; i++)
            {
                m_buf[i] = static_cast<unsigned char>(val >> 24U);
                val <<= 8U;
            }

            return *this;
        }